

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaVector<VmaPoolAllocator<VmaAllocation_T>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaAllocation_T>::ItemBlock>_>
::~VmaVector(VmaVector<VmaPoolAllocator<VmaAllocation_T>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaAllocation_T>::ItemBlock>_>
             *this)

{
  VkAllocationCallbacks *pVVar1;
  
  pVVar1 = (this->m_Allocator).m_pCallbacks;
  if ((pVVar1 != (VkAllocationCallbacks *)0x0) && (pVVar1->pfnFree != (PFN_vkFreeFunction)0x0)) {
    (*pVVar1->pfnFree)(pVVar1->pUserData,this->m_pArray);
    return;
  }
  free(this->m_pArray);
  return;
}

Assistant:

~VmaVector() { VmaFree(m_Allocator.m_pCallbacks, m_pArray); }